

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

size_t __thiscall proto2_unittest::OpenEnumMessage::ByteSizeLong(OpenEnumMessage *this)

{
  uint uVar1;
  int iVar2;
  OpenEnumMessage_TestEnum value;
  ForeignEnum value_00;
  RepeatedField<int> *pRVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  uint32_t *puVar8;
  size_t tag_size_1;
  size_t data_size_1;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  OpenEnumMessage *this_;
  OpenEnumMessage *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  pRVar3 = _internal_repeated_open(this);
  sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar3);
  iVar2 = _internal_repeated_open_size(this);
  sVar5 = google::protobuf::internal::FromIntSize(iVar2);
  pRVar3 = _internal_repeated_closed(this);
  sVar6 = google::protobuf::internal::WireFormatLite::EnumSize(pRVar3);
  iVar2 = _internal_repeated_closed_size(this);
  sVar7 = google::protobuf::internal::FromIntSize(iVar2);
  sStack_58 = sVar6 + sVar7 + sVar4 + sVar5;
  puVar8 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar8;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      value = _internal_opt_open(this);
      sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(value);
      sStack_58 = sVar4 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      value_00 = _internal_opt_closed(this);
      sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(value_00);
      sStack_58 = sVar4 + 1 + sStack_58;
    }
  }
  sVar4 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t OpenEnumMessage::ByteSizeLong() const {
  const OpenEnumMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.OpenEnumMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.OpenEnumMessage.TestEnum repeated_open = 3;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_open());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_open_size());
      total_size += data_size + tag_size;
    }
    // repeated .proto2_unittest.ForeignEnum repeated_closed = 4;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_repeated_closed());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_repeated_closed_size());
      total_size += data_size + tag_size;
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .proto2_unittest.OpenEnumMessage.TestEnum opt_open = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_opt_open());
    }
    // .proto2_unittest.ForeignEnum opt_closed = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_opt_closed());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}